

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::lazyPrintGroupInfo(ConsoleReporter *this)

{
  GroupInfo *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __rhs = (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
          nullableValue;
  if (((__rhs->name)._M_string_length != 0) && (1 < __rhs->groupsCounts)) {
    std::operator+(&local_38,"Group: ",&__rhs->name);
    printClosedHeader(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    (this->super_StreamingReporterBase).currentGroupInfo.used = true;
  }
  return;
}

Assistant:

void lazyPrintGroupInfo() {
			if (!currentGroupInfo->name.empty() && currentGroupInfo->groupsCounts > 1) {
				printClosedHeader("Group: " + currentGroupInfo->name);
				currentGroupInfo.used = true;
			}
		}